

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qrhi_p.h
# Opt level: O0

void QRhiRenderTargetAttachmentTracker::updateResIdList<QGles2Texture,QGles2RenderBuffer>
               (QRhiTextureRenderTargetDescription *desc,ResIdList *dst)

{
  int iVar1;
  long lVar2;
  QRhiRenderBuffer *pQVar3;
  QRhiTexture *pQVar4;
  QRhiColorAttachment *pQVar5;
  quint64 qVar6;
  reference pvVar7;
  quint64 qVar8;
  QVarLengthArray<QRhiRenderTargetAttachmentTracker::ResId,_17LL> *in_RSI;
  QRhiTextureRenderTargetDescription *in_RDI;
  long in_FS_OFFSET;
  bool bVar9;
  QGles2RenderBuffer *depthRbD;
  QGles2Texture *depthTexD;
  QGles2Texture *texD_1;
  QGles2RenderBuffer *rbD;
  QGles2Texture *texD;
  QRhiColorAttachment *colorAtt;
  QRhiColorAttachment *itEnd;
  QRhiColorAttachment *it;
  int n;
  bool hasDepthStencil;
  QVLABase<QRhiRenderTargetAttachmentTracker::ResId> *in_stack_ffffffffffffff08;
  QRhiColorAttachment *local_a8;
  uint uStack_7c;
  undefined4 uStack_6c;
  undefined4 uStack_5c;
  uint uStack_4c;
  undefined4 uStack_3c;
  uint uStack_2c;
  undefined4 uStack_1c;
  undefined4 uStack_c;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar3 = QRhiTextureRenderTargetDescription::depthStencilBuffer(in_RDI);
  bVar9 = true;
  if (pQVar3 == (QRhiRenderBuffer *)0x0) {
    pQVar4 = QRhiTextureRenderTargetDescription::depthTexture(in_RDI);
    bVar9 = pQVar4 != (QRhiTexture *)0x0;
  }
  QRhiTextureRenderTargetDescription::colorAttachmentCount
            ((QRhiTextureRenderTargetDescription *)0x93a642);
  QVarLengthArray<QRhiRenderTargetAttachmentTracker::ResId,_17LL>::resize
            (in_RSI,(qsizetype)in_stack_ffffffffffffff08);
  local_a8 = QRhiTextureRenderTargetDescription::cbeginColorAttachments
                       ((QRhiTextureRenderTargetDescription *)0x93a67a);
  pQVar5 = QRhiTextureRenderTargetDescription::cendColorAttachments
                     ((QRhiTextureRenderTargetDescription *)0x93a689);
  for (; local_a8 != pQVar5; local_a8 = local_a8 + 1) {
    pQVar4 = QRhiColorAttachment::texture(local_a8);
    if (pQVar4 == (QRhiTexture *)0x0) {
      pQVar3 = QRhiColorAttachment::renderBuffer(local_a8);
      if (pQVar3 == (QRhiRenderBuffer *)0x0) {
        pvVar7 = QVLABase<QRhiRenderTargetAttachmentTracker::ResId>::operator[]
                           (in_stack_ffffffffffffff08,0x93a7b3);
        pvVar7->id = 0;
        *(ulong *)&pvVar7->generation = (ulong)uStack_2c << 0x20;
      }
      else {
        pQVar3 = QRhiColorAttachment::renderBuffer(local_a8);
        qVar8 = QRhiResource::globalResourceId(&pQVar3->super_QRhiResource);
        qVar6 = pQVar3[1].super_QRhiResource.m_id;
        pvVar7 = QVLABase<QRhiRenderTargetAttachmentTracker::ResId>::operator[]
                           (in_stack_ffffffffffffff08,0x93a774);
        pvVar7->id = qVar8;
        *(ulong *)&pvVar7->generation = CONCAT44(uStack_1c,(int)qVar6);
      }
    }
    else {
      pQVar4 = QRhiColorAttachment::texture(local_a8);
      qVar6 = QRhiResource::globalResourceId(&pQVar4->super_QRhiResource);
      iVar1 = pQVar4[1].m_depth;
      pvVar7 = QVLABase<QRhiRenderTargetAttachmentTracker::ResId>::operator[]
                         (in_stack_ffffffffffffff08,0x93a709);
      pvVar7->id = qVar6;
      *(ulong *)&pvVar7->generation = CONCAT44(uStack_c,iVar1);
    }
    pQVar4 = QRhiColorAttachment::resolveTexture(local_a8);
    if (pQVar4 == (QRhiTexture *)0x0) {
      pvVar7 = QVLABase<QRhiRenderTargetAttachmentTracker::ResId>::operator[]
                         (in_stack_ffffffffffffff08,0x93a868);
      pvVar7->id = 0;
      *(ulong *)&pvVar7->generation = (ulong)uStack_4c << 0x20;
    }
    else {
      pQVar4 = QRhiColorAttachment::resolveTexture(local_a8);
      qVar6 = QRhiResource::globalResourceId(&pQVar4->super_QRhiResource);
      iVar1 = pQVar4[1].m_depth;
      pvVar7 = QVLABase<QRhiRenderTargetAttachmentTracker::ResId>::operator[]
                         (in_stack_ffffffffffffff08,0x93a829);
      pvVar7->id = qVar6;
      *(ulong *)&pvVar7->generation = CONCAT44(uStack_3c,iVar1);
    }
  }
  if (bVar9) {
    pQVar4 = QRhiTextureRenderTargetDescription::depthTexture(in_RDI);
    if (pQVar4 == (QRhiTexture *)0x0) {
      pQVar3 = QRhiTextureRenderTargetDescription::depthStencilBuffer(in_RDI);
      if (pQVar3 == (QRhiRenderBuffer *)0x0) {
        pvVar7 = QVLABase<QRhiRenderTargetAttachmentTracker::ResId>::operator[]
                           (in_stack_ffffffffffffff08,0x93a9a0);
        pvVar7->id = 0;
        *(ulong *)&pvVar7->generation = (ulong)uStack_7c << 0x20;
      }
      else {
        pQVar3 = QRhiTextureRenderTargetDescription::depthStencilBuffer(in_RDI);
        qVar8 = QRhiResource::globalResourceId(&pQVar3->super_QRhiResource);
        qVar6 = pQVar3[1].super_QRhiResource.m_id;
        pvVar7 = QVLABase<QRhiRenderTargetAttachmentTracker::ResId>::operator[]
                           (in_stack_ffffffffffffff08,0x93a967);
        pvVar7->id = qVar8;
        *(ulong *)&pvVar7->generation = CONCAT44(uStack_6c,(int)qVar6);
      }
    }
    else {
      pQVar4 = QRhiTextureRenderTargetDescription::depthTexture(in_RDI);
      qVar6 = QRhiResource::globalResourceId(&pQVar4->super_QRhiResource);
      iVar1 = pQVar4[1].m_depth;
      pvVar7 = QVLABase<QRhiRenderTargetAttachmentTracker::ResId>::operator[]
                         (in_stack_ffffffffffffff08,0x93a8fc);
      pvVar7->id = qVar6;
      *(ulong *)&pvVar7->generation = CONCAT44(uStack_5c,iVar1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QRhiRenderTargetAttachmentTracker::updateResIdList(const QRhiTextureRenderTargetDescription &desc, ResIdList *dst)
{
    const bool hasDepthStencil = desc.depthStencilBuffer() || desc.depthTexture();
    dst->resize(desc.colorAttachmentCount() * 2 + (hasDepthStencil ? 1 : 0));
    int n = 0;
    for (auto it = desc.cbeginColorAttachments(), itEnd = desc.cendColorAttachments(); it != itEnd; ++it, ++n) {
        const QRhiColorAttachment &colorAtt(*it);
        if (colorAtt.texture()) {
            TexType *texD = QRHI_RES(TexType, colorAtt.texture());
            (*dst)[n] = { texD->globalResourceId(), texD->generation };
        } else if (colorAtt.renderBuffer()) {
            RenderBufferType *rbD = QRHI_RES(RenderBufferType, colorAtt.renderBuffer());
            (*dst)[n] = { rbD->globalResourceId(), rbD->generation };
        } else {
            (*dst)[n] = { 0, 0 };
        }
        ++n;
        if (colorAtt.resolveTexture()) {
            TexType *texD = QRHI_RES(TexType, colorAtt.resolveTexture());
            (*dst)[n] = { texD->globalResourceId(), texD->generation };
        } else {
            (*dst)[n] = { 0, 0 };
        }
    }
    if (hasDepthStencil) {
        if (desc.depthTexture()) {
            TexType *depthTexD = QRHI_RES(TexType, desc.depthTexture());
            (*dst)[n] = { depthTexD->globalResourceId(), depthTexD->generation };
        } else if (desc.depthStencilBuffer()) {
            RenderBufferType *depthRbD = QRHI_RES(RenderBufferType, desc.depthStencilBuffer());
            (*dst)[n] = { depthRbD->globalResourceId(), depthRbD->generation };
        } else {
            (*dst)[n] = { 0, 0 };
        }
    }
}